

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

string * nonius::html_reporter::escape(string *__return_storage_ptr__,string *source)

{
  int iVar1;
  long lVar2;
  undefined1 local_119;
  undefined1 local_118;
  undefined1 local_117;
  char local_116 [6];
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (escape(std::__cxx11::string_const&)::escapes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    if (iVar1 != 0) {
      local_116[5] = 0x27;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_110,local_116 + 5,(char (*) [7])"&apos;");
      local_116[4] = 0x22;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_e8,local_116 + 4,(char (*) [7])"&quot;");
      local_116[3] = 0x3c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_c0,local_116 + 3,(char (*) [5])"&lt;");
      local_116[2] = 0x3e;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_98,local_116 + 2,(char (*) [5])"&gt;");
      local_116[1] = 0x26;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_70,local_116 + 1,(char (*) [6])"&amp;");
      local_116[0] = '\\';
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[3],_true>(&local_48,local_116,(char (*) [3])"\\\\");
      std::
      _Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,std::__cxx11::string>const*>
                ((_Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_,&local_110,
                 &stack0xffffffffffffffe0,0,&local_117,&local_118,&local_119);
      lVar2 = 0xd0;
      do {
        std::__cxx11::string::~string((string *)(&local_110.first + lVar2));
        lVar2 = lVar2 + -0x28;
      } while (lVar2 != -0x20);
      __cxa_atexit(std::
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    }
  }
  detail::escape(__return_storage_ptr__,source,
                 &escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string const& source) {
            static const std::unordered_map<char, std::string> escapes {
                { '\'', "&apos;" },
                { '"',  "&quot;" },
                { '<',  "&lt;"   },
                { '>',  "&gt;"   },
                { '&',  "&amp;"  },
                { '\\',  "\\\\"  },
            };
            return detail::escape(source, escapes);
        }